

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_dtoa(JSContext *ctx,double d,int radix,int n_digits,int flags)

{
  size_t buf_len;
  JSValue JVar1;
  char buf [128];
  char acStack_98 [136];
  
  js_dtoa1(acStack_98,d,radix,n_digits,flags);
  buf_len = strlen(acStack_98);
  JVar1 = JS_NewStringLen(ctx,acStack_98,buf_len);
  return JVar1;
}

Assistant:

static JSValue js_dtoa(JSContext *ctx,
                       double d, int radix, int n_digits, int flags)
{
    char buf[JS_DTOA_BUF_SIZE];
    js_dtoa1(buf, d, radix, n_digits, flags);
    return JS_NewString(ctx, buf);
}